

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void __thiscall xemmai::ast::t_symbol_get::f_flow(t_symbol_get *this,t_flow *a_flow)

{
  iterator iVar1;
  t_variable *ptVar2;
  uint uVar3;
  t_scope *ptVar4;
  
  this->v_resolved = this->v_outer;
  ptVar4 = (t_scope *)&this->v_scope;
  do {
    ptVar4 = ptVar4->v_outer;
    if (ptVar4 == (t_scope *)0x0) {
      ptVar2 = this->v_variable;
      if (ptVar2 != (t_variable *)0x0) {
LAB_0014bc3f:
        if ((ptVar2->v_shared == false) &&
           (uVar3 = (int)(_Base_ptr)ptVar2->v_index - (int)a_flow->v_arguments, -1 < (int)uVar3)) {
          t_block::f_use(a_flow->v_current,(ulong)(uVar3 & 0x7fffffff),false);
          return;
        }
      }
      return;
    }
    iVar1 = std::
            _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
            ::find(&(ptVar4->v_variables)._M_t,&this->v_symbol);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(ptVar4->v_variables)._M_t._M_impl.super__Rb_tree_header) {
      ptVar2 = (t_variable *)&iVar1._M_node[1]._M_parent;
      this->v_variable = ptVar2;
      goto LAB_0014bc3f;
    }
    this->v_resolved = this->v_resolved + 1;
  } while( true );
}

Assistant:

void t_symbol_get::f_flow(t_flow& a_flow)
{
	v_resolved = v_outer;
	for (auto scope = v_scope; scope; scope = scope->v_outer) {
		auto i = scope->v_variables.find(v_symbol);
		if (i != scope->v_variables.end()) {
			v_variable = &i->second;
			break;
		}
		++v_resolved;
	}
	if (!v_variable || v_variable->v_shared) return;
	int i = v_variable->v_index - a_flow.v_arguments;
	if (i >= 0) a_flow.v_current->f_use(i, false);
}